

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_32sto7u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  OPJ_INT32 OVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  uint uVar9;
  
  uVar6 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      uVar9 = pSrc[uVar6 + 1];
      uVar8 = pSrc[uVar6 + 2];
      uVar1 = pSrc[uVar6 + 3];
      uVar2 = pSrc[uVar6 + 4];
      uVar3 = pSrc[uVar6 + 5];
      uVar4 = pSrc[uVar6 + 6];
      OVar5 = pSrc[uVar6 + 7];
      *pDst = (byte)(uVar9 >> 6) | (char)pSrc[uVar6] * '\x02';
      pDst[1] = (byte)(uVar8 >> 5) | (byte)(uVar9 << 2);
      pDst[2] = (byte)(uVar1 >> 4) | (byte)(uVar8 << 3);
      pDst[3] = (byte)(uVar2 >> 3) | (byte)(uVar1 << 4);
      pDst[4] = (byte)(uVar3 >> 2) | (byte)(uVar2 << 5);
      pDst[5] = (byte)(uVar4 >> 1) | (byte)(uVar3 << 6);
      pDst[6] = (byte)(uVar4 << 7) | (byte)OVar5;
      pDst = pDst + 7;
      uVar6 = uVar6 + 8;
    } while (uVar6 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    uVar9 = pSrc[uVar6];
    sVar7 = 1;
    uVar8 = (uint)(length & 7);
    if (uVar8 != 1) {
      *pDst = (byte)((uint)pSrc[uVar6 + 1] >> 6) | (char)uVar9 * '\x02';
      uVar9 = pSrc[uVar6 + 1] & 0x3f;
      if (uVar8 < 3) {
        pDst = pDst + 1;
        sVar7 = 2;
      }
      else {
        pDst[1] = (byte)((uint)pSrc[uVar6 + 2] >> 5) | (byte)(uVar9 << 2);
        uVar9 = pSrc[uVar6 + 2] & 0x1f;
        if (uVar8 == 3) {
          pDst = pDst + 2;
          sVar7 = 3;
        }
        else {
          pDst[2] = (byte)((uint)pSrc[uVar6 + 3] >> 4) | (byte)(uVar9 << 3);
          uVar9 = pSrc[uVar6 + 3] & 0xf;
          if (uVar8 < 5) {
            pDst = pDst + 3;
            sVar7 = 4;
          }
          else {
            pDst[3] = (byte)((uint)pSrc[uVar6 + 4] >> 3) | (byte)(uVar9 << 4);
            uVar9 = pSrc[uVar6 + 4] & 7;
            if (uVar8 == 5) {
              pDst = pDst + 4;
              sVar7 = 5;
            }
            else {
              pDst[4] = (byte)((uint)pSrc[uVar6 + 5] >> 2) | (byte)(uVar9 << 5);
              uVar9 = pSrc[uVar6 + 5] & 3;
              if (uVar8 == 7) {
                pDst[5] = (byte)((uint)pSrc[uVar6 + 6] >> 1) | (byte)(uVar9 << 6);
                uVar9 = pSrc[uVar6 + 6] & 1;
                pDst = pDst + 6;
                sVar7 = 7;
              }
              else {
                pDst = pDst + 5;
                sVar7 = 6;
              }
            }
          }
        }
      }
    }
    *pDst = (byte)(uVar9 << sVar7);
  }
  return;
}

Assistant:

static void tif_32sto7u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i+4];
		OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i+5];
		OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i+6];
		OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i+7];
		
		*pDst++ = (OPJ_BYTE)((src0 << 1) | (src1 >> 6));
		*pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 5));
		*pDst++ = (OPJ_BYTE)((src2 << 3) | (src3 >> 4));
		*pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 3));
		*pDst++ = (OPJ_BYTE)((src4 << 5) | (src5 >> 2));
		*pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 1));
		*pDst++ = (OPJ_BYTE)((src6 << 7) | (src7));
	}
	
	if (length & 7U) {
		unsigned int trailing = 0U;
		int remaining = 8U;
		length &= 7U;
		PUTBITS((OPJ_UINT32)pSrc[i+0], 7)
		if (length > 1U) {
			PUTBITS((OPJ_UINT32)pSrc[i+1], 7)
			if (length > 2U) {
				PUTBITS((OPJ_UINT32)pSrc[i+2], 7)
				if (length > 3U) {
					PUTBITS((OPJ_UINT32)pSrc[i+3], 7)
					if (length > 4U) {
						PUTBITS((OPJ_UINT32)pSrc[i+4], 7)
						if (length > 5U) {
							PUTBITS((OPJ_UINT32)pSrc[i+5], 7)
							if (length > 6U) {
								PUTBITS((OPJ_UINT32)pSrc[i+6], 7)
							}
						}
					}
				}
			}
		}
		FLUSHBITS()
	}
}